

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_ARB1_SGN(Context *ctx)

{
  char local_118 [8];
  char scratch2 [64];
  char scratch1 [64];
  char src0 [64];
  char dst [64];
  Context *ctx_local;
  
  if (ctx->profile_supports_nv2 == 0) {
    make_ARB1_destarg_string(ctx,src0 + 0x38,0x40);
    make_ARB1_srcarg_string(ctx,0,scratch1 + 0x38,0x40);
    allocate_ARB1_scratch_reg_name(ctx,scratch2 + 0x38,0x40);
    allocate_ARB1_scratch_reg_name(ctx,local_118,0x40);
    output_line(ctx,"SLT %s, %s, 0.0;",scratch2 + 0x38,scratch1 + 0x38);
    output_line(ctx,"SLT %s, -%s, 0.0;",local_118,scratch1 + 0x38);
    output_line(ctx,"ADD%s -%s, %s;",src0 + 0x38,scratch2 + 0x38,local_118);
    emit_ARB1_dest_modifiers(ctx);
  }
  else {
    emit_ARB1_opcode_ds(ctx,"SSG");
  }
  return;
}

Assistant:

static void emit_ARB1_SGN(Context *ctx)
{
    if (support_nv2(ctx))
        emit_ARB1_opcode_ds(ctx, "SSG");
    else
    {
        char dst[64];
        char src0[64];
        char scratch1[64];
        char scratch2[64];
        make_ARB1_destarg_string(ctx, dst, sizeof (dst));
        make_ARB1_srcarg_string(ctx, 0, src0, sizeof (src0));
        allocate_ARB1_scratch_reg_name(ctx, scratch1, sizeof (scratch1));
        allocate_ARB1_scratch_reg_name(ctx, scratch2, sizeof (scratch2));
        output_line(ctx, "SLT %s, %s, 0.0;", scratch1, src0);
        output_line(ctx, "SLT %s, -%s, 0.0;", scratch2, src0);
        output_line(ctx, "ADD%s -%s, %s;", dst, scratch1, scratch2);
        emit_ARB1_dest_modifiers(ctx);
    } // else
}